

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::compressedtexsubimage2d_neg_width_height
               (NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  int imageSize;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  deUint32 texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&pNStack_10->super_CallLogWrapper,0xde1,local_14);
  pNVar1 = pNStack_10;
  imageSize = etc2EacDataSize(0x10,0x10);
  glu::CallLogWrapper::glCompressedTexImage2D
            (&pNVar1->super_CallLogWrapper,0xde1,0,0x9278,0x10,0x10,0,imageSize,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if width or height is less than 0."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0,0,-4,0,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0,0,0,-4,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  glu::CallLogWrapper::glCompressedTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0,0,-4,-4,0x9278,0,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501,0x502);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteTextures(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void compressedtexsubimage2d_neg_width_height (NegativeTestContext& ctx)
{
	deUint32				texture = 0x1234;
	ctx.glGenTextures			(1, &texture);
	ctx.glBindTexture			(GL_TEXTURE_2D, texture);
	ctx.glCompressedTexImage2D	(GL_TEXTURE_2D, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 16, 16, 0, etc2EacDataSize(16, 16), 0);
	ctx.expectError				(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE or GL_INVALID_OPERATION is generated if width or height is less than 0.");
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, -4, 0, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, -4, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.glCompressedTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, -4, -4, GL_COMPRESSED_RGBA8_ETC2_EAC, 0, 0);
	ctx.expectError(GL_INVALID_VALUE, GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures(1,		&texture);
}